

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O1

bool __thiscall absl::CondVar::WaitWithDeadline(CondVar *this,Mutex *mu,Time deadline)

{
  bool bVar1;
  int64_t iVar2;
  int64_t iVar3;
  KernelTimeout t;
  Time t_00;
  
  t_00.rep_._8_8_ = (absl *)deadline.rep_.rep_hi_;
  if (t_00.rep_._8_8_ == (absl *)0x7fffffffffffffff && deadline.rep_.rep_lo_ == 0xffffffff) {
    t.ns_ = 0;
  }
  else {
    t_00.rep_.rep_hi_ = (ulong)deadline.rep_.rep_lo_;
    iVar2 = ToUnixNanos(t_00.rep_._8_8_,t_00);
    iVar3 = 1;
    if (1 < iVar2) {
      iVar3 = iVar2;
    }
    t.ns_ = 0;
    if (iVar2 != 0x7fffffffffffffff) {
      t.ns_ = iVar3;
    }
  }
  bVar1 = WaitCommon(this,mu,t);
  return bVar1;
}

Assistant:

bool CondVar::WaitWithDeadline(Mutex *mu, absl::Time deadline) {
  return WaitCommon(mu, KernelTimeout(deadline));
}